

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall
Highs::changeRowsBounds(Highs *this,HighsInt from_row,HighsInt to_row,double *lower,double *upper)

{
  HighsInt HVar1;
  HighsStatus HVar2;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  HighsStatus return_status;
  HighsStatus call_status;
  double *in_stack_000000d0;
  double *in_stack_000000d8;
  HighsInt create_error;
  HighsIndexCollection index_collection;
  HighsLogOptions *in_stack_fffffffffffffea8;
  HighsStatus in_stack_fffffffffffffeb0;
  HighsStatus in_stack_fffffffffffffeb4;
  allocator local_119;
  string local_118 [8];
  string *in_stack_fffffffffffffef0;
  HighsStatus in_stack_fffffffffffffef8;
  HighsStatus in_stack_fffffffffffffefc;
  Highs *in_stack_ffffffffffffff00;
  HighsIndexCollection local_78;
  uint local_18;
  uint local_14;
  HighsStatus local_4;
  
  local_18 = in_EDX;
  local_14 = in_ESI;
  clearDerivedModelProperties
            ((Highs *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  HighsIndexCollection::HighsIndexCollection
            ((HighsIndexCollection *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  HVar1 = create(&local_78,local_14,local_18,*(HighsInt *)(in_RDI + 0x13c));
  if (HVar1 == 0) {
    changeRowBoundsInterface
              ((Highs *)index_collection._8_8_,(HighsIndexCollection *)index_collection._0_8_,
               in_stack_000000d8,in_stack_000000d0);
    HighsLogOptions::HighsLogOptions
              ((HighsLogOptions *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
               in_stack_fffffffffffffea8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_118,"changeRowBounds",&local_119);
    HVar2 = interpretCallStatus((HighsLogOptions *)in_stack_ffffffffffffff00,
                                in_stack_fffffffffffffefc,in_stack_fffffffffffffef8,
                                in_stack_fffffffffffffef0);
    in_stack_fffffffffffffeb4 = HVar2;
    std::__cxx11::string::~string(local_118);
    std::allocator<char>::~allocator((allocator<char> *)&local_119);
    HighsLogOptions::~HighsLogOptions((HighsLogOptions *)0x495806);
    if (HVar2 == kError) {
      local_4 = kError;
    }
    else {
      in_stack_fffffffffffffeb0 =
           returnFromHighs(in_stack_ffffffffffffff00,in_stack_fffffffffffffefc);
      local_4 = in_stack_fffffffffffffeb0;
    }
  }
  else {
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                 "Interval [%d, %d] supplied to Highs::changeRowsBounds is out of range [0, %d)\n",
                 (ulong)local_14,(ulong)local_18,(ulong)*(uint *)(in_RDI + 0x13c));
    local_4 = kError;
  }
  HighsIndexCollection::~HighsIndexCollection
            ((HighsIndexCollection *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
  return local_4;
}

Assistant:

HighsStatus Highs::changeRowsBounds(const HighsInt from_row,
                                    const HighsInt to_row, const double* lower,
                                    const double* upper) {
  clearDerivedModelProperties();
  HighsIndexCollection index_collection;
  const HighsInt create_error =
      create(index_collection, from_row, to_row, model_.lp_.num_row_);
  if (create_error) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Interval [%d, %d] supplied to Highs::changeRowsBounds is out "
                 "of range [0, %d)\n",
                 int(from_row), int(to_row), int(model_.lp_.num_row_));
    return HighsStatus::kError;
  }
  HighsStatus call_status =
      changeRowBoundsInterface(index_collection, lower, upper);
  HighsStatus return_status = HighsStatus::kOk;
  return_status = interpretCallStatus(options_.log_options, call_status,
                                      return_status, "changeRowBounds");
  if (return_status == HighsStatus::kError) return HighsStatus::kError;
  return returnFromHighs(return_status);
}